

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O2

void advance_engine<trng::yarn3>(yarn3 *r1,long N)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = 0;
  if (0 < N) {
    lVar1 = N;
  }
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    trng::yarn3::operator()(r1);
  }
  return;
}

Assistant:

void advance_engine(R &r1, const long N) {
  for (long i{0}; i < N; ++i)
    r1();
}